

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall CVmObjTable::request_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  undefined1 *puVar1;
  CVmHashTable *this_00;
  CVmHashEntry *pCVar2;
  CVmHashEntryPLI *this_01;
  vm_obj_id_t obj_local;
  
  obj_local = obj;
  pCVar2 = CVmHashTable::find(this->post_load_init_table_,(char *)&obj_local,4);
  if (pCVar2 == (CVmHashEntry *)0x0) {
    this_00 = this->post_load_init_table_;
    this_01 = (CVmHashEntryPLI *)operator_new(0x30);
    CVmHashEntryPLI::CVmHashEntryPLI(this_01,obj_local);
    CVmHashTable::add(this_00,(CVmHashEntry *)this_01);
    puVar1 = &this->pages_[obj_local >> 0xc][obj_local & 0xfff].field_0x14;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x100;
  }
  return;
}

Assistant:

void CVmObjTable::request_post_load_init(vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* check for an existing entry - if there's not one already, add one */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));
    if (entry == 0)
    {
        /* it's not there yet - add a new entry */
        post_load_init_table_->add(new CVmHashEntryPLI(obj));

        /* mark the object as having requested post-load initialization */
        get_entry(obj)->requested_post_load_init_ = TRUE;
    }
}